

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-test.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_0::ArrayComparisonTest<const_unsigned_int,_const_unsigned_int>::ArrayComparisonTest
          (ArrayComparisonTest<const_unsigned_int,_const_unsigned_int> *this,
          initializer_list<const_unsigned_int> left,initializer_list<const_unsigned_int> right,
          TestOrdering expectedResult)

{
  initializer_list<const_unsigned_int> init;
  initializer_list<const_unsigned_int> init_00;
  TestOrdering expectedResult_local;
  ArrayComparisonTest<const_unsigned_int,_const_unsigned_int> *this_local;
  initializer_list<const_unsigned_int> right_local;
  initializer_list<const_unsigned_int> left_local;
  kj *pkVar1;
  
  init._M_len = (kj *)right._M_array;
  init._M_array = (iterator)left._M_len;
  pkVar1 = init._M_len;
  heapArray<unsigned_int_const>(&this->left,(kj *)left._M_array,init);
  init_00._M_len = (size_type)pkVar1;
  init_00._M_array = (iterator)right._M_len;
  heapArray<unsigned_int_const>(&this->right,init._M_len,init_00);
  this->expectedResult = expectedResult;
  return;
}

Assistant:

ArrayComparisonTest(std::initializer_list<A> left, std::initializer_list<B> right, TestOrdering expectedResult) :
    left(heapArray(left)), right(heapArray(right)), expectedResult(expectedResult) {}